

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O2

shared_ptr<IWalker> __thiscall
cinject::
CastInstanceRetriever<Turtle,_IWalker,_cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
::forwardInstance(CastInstanceRetriever<Turtle,_IWalker,_cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>_>
                  *this,InjectionContext *context)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<IWalker> sVar1;
  undefined1 local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  (**(code **)((context->componentStack_).
               super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
               ._M_impl.super__Vector_impl_data._M_start)->typeInfo)(local_20);
  std::dynamic_pointer_cast<IWalker,Turtle>((shared_ptr<Turtle> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1.super___shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<IWalker>)sVar1.super___shared_ptr<IWalker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TInterface> forwardInstance(InjectionContext* context) override
    {
        return std::dynamic_pointer_cast<TInterface>(storage_->getInstance(context));
    }